

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool process_args(int argc,char **argv,conf_t *config)

{
  int iVar1;
  size_type sVar2;
  int local_24;
  int i;
  conf_t *config_local;
  char **argv_local;
  int argc_local;
  
  local_24 = 1;
  while( true ) {
    if (argc <= local_24) {
      sVar2 = std::vector<char_*,_std::allocator<char_*>_>::size(&config->files);
      return sVar2 != 0;
    }
    iVar1 = strcmp(argv[local_24],"-h");
    if (iVar1 == 0) break;
    iVar1 = strcmp(argv[local_24],"-v");
    if (iVar1 == 0) {
      config->verbose = true;
    }
    else {
      iVar1 = strcmp(argv[local_24],"-s");
      if (iVar1 == 0) {
        config->simulate = true;
      }
      else {
        iVar1 = strcmp(argv[local_24],"-o");
        if (iVar1 == 0) {
          if (argc + -1 <= local_24) {
            return false;
          }
          local_24 = local_24 + 1;
          std::__cxx11::string::operator=((string *)&config->output_path,argv[local_24]);
        }
        else {
          std::vector<char_*,_std::allocator<char_*>_>::push_back(&config->files,argv + local_24);
        }
      }
    }
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

bool process_args(int argc, char **argv, conf_t &config)
{
	for (int i = 1; i < argc; ++i) {
		if (!strcmp(argv[i], "-h")) {
			return false;
		} else if (!strcmp(argv[i], "-v")) {
			config.verbose = true;
		} else if (!strcmp(argv[i], "-s")) {
			config.simulate = true;
		} else if (!strcmp(argv[i], "-o")) {
			if (i < argc - 1) {
				config.output_path = argv[++i];
			} else {
				return false;
			}
		} else {
			config.files.push_back(argv[i]);
		}
	}

	if (config.files.size() > 0) {
		return true;
	} else {
		return false;
	}
}